

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_context.c
# Opt level: O2

int test_contexts_cipher(char *name,int enc,int acpkm)

{
  undefined8 uVar1;
  bool bVar2;
  size_t sVar3;
  int iVar4;
  EVP_CIPHER *cipher;
  EVP_CIPHER_CTX *ctx;
  long lVar5;
  EVP_CIPHER_CTX *out;
  undefined8 *puVar6;
  int *piVar7;
  uint uVar8;
  char *pcVar9;
  uint uVar10;
  EVP_CIPHER_CTX *ctx_00;
  undefined8 uStack_3b0;
  int outlen;
  int tmplen;
  EVP_CIPHER *local_3a0;
  uchar iv [16];
  uchar K [32];
  size_t v_1;
  size_t v;
  uchar auStack_358 [4];
  uchar auStack_354 [4];
  uchar local_350 [4];
  uchar auStack_34c [4];
  uchar auStack_348 [4];
  uchar auStack_344 [4];
  uchar local_340 [8];
  uchar c [256];
  uchar b [256];
  uchar pt [256];
  
  piVar7 = &outlen;
  uStack_3b0 = 0x102904;
  memset(pt,0,0x100);
  pt[0] = '\x01';
  K[0x10] = '\0';
  K[0x11] = '\0';
  K[0x12] = '\0';
  K[0x13] = '\0';
  K[0x14] = '\0';
  K[0x15] = '\0';
  K[0x16] = '\0';
  K[0x17] = '\0';
  K[0x18] = '\0';
  K[0x19] = '\0';
  K[0x1a] = '\0';
  K[0x1b] = '\0';
  K[0x1c] = '\0';
  K[0x1d] = '\0';
  K[0x1e] = '\0';
  K[0x1f] = '\0';
  K[0] = '\x01';
  K[1] = '\0';
  K[2] = '\0';
  K[3] = '\0';
  K[4] = '\0';
  K[5] = '\0';
  K[6] = '\0';
  K[7] = '\0';
  K[8] = '\0';
  K[9] = '\0';
  K[10] = '\0';
  K[0xb] = '\0';
  K[0xc] = '\0';
  K[0xd] = '\0';
  K[0xe] = '\0';
  K[0xf] = '\0';
  iv[0] = '\x01';
  iv[1] = '\0';
  iv[2] = '\0';
  iv[3] = '\0';
  iv[4] = '\0';
  iv[5] = '\0';
  iv[6] = '\0';
  iv[7] = '\0';
  iv[8] = '\0';
  iv[9] = '\0';
  iv[10] = '\0';
  iv[0xb] = '\0';
  iv[0xc] = '\0';
  iv[0xd] = '\0';
  iv[0xe] = '\0';
  iv[0xf] = '\0';
  uStack_3b0 = 0x102930;
  ERR_set_mark();
  uStack_3b0 = 0x102938;
  cipher = EVP_get_cipherbyname(name);
  if (cipher == (EVP_CIPHER *)0x0) {
    uStack_3b0 = 0x102949;
    cipher = (EVP_CIPHER *)EVP_CIPHER_fetch(0,name,0);
    if (cipher == (EVP_CIPHER *)0x0) {
      uStack_3b0 = 0x10303e;
      ERR_print_errors_fp(_stderr);
      pcVar9 = 
      "(type = (EVP_CIPHER *)EVP_get_cipherbyname(name)) || (type = EVP_CIPHER_fetch(NULL, name, NULL))"
      ;
      puVar6 = &uStack_3b0;
      uStack_3b0 = 0x46;
      goto LAB_00102e9d;
    }
  }
  uStack_3b0 = 0x10295a;
  ERR_pop_to_mark();
  pcVar9 = "Encryption";
  if (enc == 0) {
    pcVar9 = "Decryption";
  }
  uStack_3b0 = 0x102980;
  printf("\x1b[1;34m%s test for %s\x1b[m\n",pcVar9,name);
  uStack_3b0 = 0x102985;
  ctx = EVP_CIPHER_CTX_new();
  if (ctx == (EVP_CIPHER_CTX *)0x0) goto LAB_00102ea3;
  uStack_3b0 = 0x1029ab;
  iVar4 = EVP_CipherInit_ex(ctx,cipher,(ENGINE *)0x0,K,iv,enc);
  if (iVar4 == 0) {
    uStack_3b0 = 0x102ed3;
    ERR_print_errors_fp(_stderr);
    pcVar9 = "EVP_CipherInit_ex(ctx, type, NULL, K, iv, enc)";
    puVar6 = &uStack_3b0;
    uStack_3b0 = 0x4f;
    goto LAB_00102e9d;
  }
  if (acpkm != 0) {
    uStack_3b0 = 0x1029c6;
    lVar5 = EVP_CIPHER_get0_provider(cipher);
    if (lVar5 == 0) {
      uStack_3b0 = 0x102a5f;
      iVar4 = EVP_CIPHER_CTX_ctrl(ctx,0x20,acpkm,(void *)0x0);
      if (iVar4 == 0) {
        uStack_3b0 = 0x103062;
        ERR_print_errors_fp(_stderr);
        pcVar9 = "EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, acpkm, NULL)";
        puVar6 = &uStack_3b0;
        uStack_3b0 = 0x58;
        goto LAB_00102e9d;
      }
    }
    else {
      b[0x40] = '\0';
      b[0x41] = '\0';
      b[0x42] = '\0';
      b[0x43] = '\0';
      b[0x44] = '\0';
      b[0x45] = '\0';
      b[0x46] = '\0';
      b[0x47] = '\0';
      b[0x48] = '\0';
      b[0x49] = '\0';
      b[0x4a] = '\0';
      b[0x4b] = '\0';
      b[0x4c] = '\0';
      b[0x4d] = '\0';
      b[0x4e] = '\0';
      b[0x4f] = '\0';
      b[0x30] = '\0';
      b[0x31] = '\0';
      b[0x32] = '\0';
      b[0x33] = '\0';
      b[0x34] = '\0';
      b[0x35] = '\0';
      b[0x36] = '\0';
      b[0x37] = '\0';
      b[0x38] = '\0';
      b[0x39] = '\0';
      b[0x3a] = '\0';
      b[0x3b] = '\0';
      b[0x3c] = '\0';
      b[0x3d] = '\0';
      b[0x3e] = '\0';
      b[0x3f] = '\0';
      b[0x20] = '\0';
      b[0x21] = '\0';
      b[0x22] = '\0';
      b[0x23] = '\0';
      b[0x24] = '\0';
      b[0x25] = '\0';
      b[0x26] = '\0';
      b[0x27] = '\0';
      b[0x28] = '\0';
      b[0x29] = '\0';
      b[0x2a] = '\0';
      b[0x2b] = '\0';
      b[0x2c] = '\0';
      b[0x2d] = '\0';
      b[0x2e] = '\0';
      b[0x2f] = '\0';
      b[0x10] = '\0';
      b[0x11] = '\0';
      b[0x12] = '\0';
      b[0x13] = '\0';
      b[0x14] = '\0';
      b[0x15] = '\0';
      b[0x16] = '\0';
      b[0x17] = '\0';
      b[0x18] = '\0';
      b[0x19] = '\0';
      b[0x1a] = '\0';
      b[0x1b] = '\0';
      b[0x1c] = '\0';
      b[0x1d] = '\0';
      b[0x1e] = '\0';
      b[0x1f] = '\0';
      b[0] = '\0';
      b[1] = '\0';
      b[2] = '\0';
      b[3] = '\0';
      b[4] = '\0';
      b[5] = '\0';
      b[6] = '\0';
      b[7] = '\0';
      b[8] = '\0';
      b[9] = '\0';
      b[10] = '\0';
      b[0xb] = '\0';
      b[0xc] = '\0';
      b[0xd] = '\0';
      b[0xe] = '\0';
      b[0xf] = '\0';
      uStack_3b0 = 0x102a18;
      local_3a0 = (EVP_CIPHER *)(long)acpkm;
      v = (size_t)(long)acpkm;
      OSSL_PARAM_construct_size_t(c,"key-mesh");
      b[0x20] = c[0x20];
      b[0x21] = c[0x21];
      b[0x22] = c[0x22];
      b[0x23] = c[0x23];
      b[0x24] = c[0x24];
      b[0x25] = c[0x25];
      b[0x26] = c[0x26];
      b[0x27] = c[0x27];
      uStack_3b0 = 0x102a41;
      iVar4 = EVP_CIPHER_CTX_set_params(ctx);
      if (iVar4 == 0) {
LAB_0010300b:
        uStack_3b0 = 0x10301a;
        ERR_print_errors_fp(_stderr);
        pcVar9 = "EVP_CIPHER_CTX_set_params(ctx, params)";
        puVar6 = &uStack_3b0;
        uStack_3b0 = 0x56;
        goto LAB_00102e9d;
      }
    }
  }
  uStack_3b0 = 0x102a71;
  iVar4 = EVP_CIPHER_CTX_set_padding(ctx,0);
  if (iVar4 == 0) {
    uStack_3b0 = 0x102ef4;
    ERR_print_errors_fp(_stderr);
    pcVar9 = "EVP_CIPHER_CTX_set_padding(ctx, 0)";
    puVar6 = &uStack_3b0;
    uStack_3b0 = 0x5b;
  }
  else {
    uStack_3b0 = 0x102a9a;
    iVar4 = EVP_CipherUpdate(ctx,b,&outlen,pt,0x100);
    if (iVar4 == 0) {
      uStack_3b0 = 0x102f15;
      ERR_print_errors_fp(_stderr);
      pcVar9 = "EVP_CipherUpdate(ctx, b, &outlen, pt, sizeof(b))";
      puVar6 = &uStack_3b0;
      uStack_3b0 = 0x5c;
    }
    else {
      uStack_3b0 = 0x102abe;
      iVar4 = EVP_CipherFinal_ex(ctx,b + outlen,&tmplen);
      if (iVar4 == 0) {
        uStack_3b0 = 0x102f39;
        ERR_print_errors_fp(_stderr);
        pcVar9 = "EVP_CipherFinal_ex(ctx, b + outlen, &tmplen)";
        puVar6 = &uStack_3b0;
        uStack_3b0 = 0x5d;
      }
      else {
        uStack_3b0 = 0x102ace;
        EVP_CIPHER_CTX_reset(ctx);
        uStack_3b0 = 0x102ad6;
        EVP_CIPHER_CTX_reset(ctx);
        uStack_3b0 = 0x102af0;
        iVar4 = EVP_CipherInit_ex(ctx,cipher,(ENGINE *)0x0,K,iv,enc);
        if (iVar4 == 0) {
          uStack_3b0 = 0x102f5d;
          ERR_print_errors_fp(_stderr);
          pcVar9 = "EVP_CipherInit_ex(ctx, type, NULL, K, iv, enc)";
          puVar6 = &uStack_3b0;
          uStack_3b0 = 0x62;
        }
        else {
          uStack_3b0 = 0x102b02;
          iVar4 = EVP_CIPHER_CTX_set_padding(ctx,0);
          if (iVar4 == 0) {
            uStack_3b0 = 0x102f81;
            ERR_print_errors_fp(_stderr);
            pcVar9 = "EVP_CIPHER_CTX_set_padding(ctx, 0)";
            puVar6 = &uStack_3b0;
            uStack_3b0 = 99;
          }
          else {
            if (acpkm != 0) {
              uStack_3b0 = 0x102b1a;
              lVar5 = EVP_CIPHER_get0_provider(cipher);
              if (lVar5 == 0) {
                uStack_3b0 = 0x102bb5;
                iVar4 = EVP_CIPHER_CTX_ctrl(ctx,0x20,acpkm,(void *)0x0);
                if (iVar4 == 0) {
                  uStack_3b0 = 0x103086;
                  ERR_print_errors_fp(_stderr);
                  pcVar9 = "EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, acpkm, NULL)";
                  puVar6 = &uStack_3b0;
                  uStack_3b0 = 0x6c;
                  goto LAB_00102e9d;
                }
              }
              else {
                c[0x40] = '\0';
                c[0x41] = '\0';
                c[0x42] = '\0';
                c[0x43] = '\0';
                c[0x44] = '\0';
                c[0x45] = '\0';
                c[0x46] = '\0';
                c[0x47] = '\0';
                c[0x48] = '\0';
                c[0x49] = '\0';
                c[0x4a] = '\0';
                c[0x4b] = '\0';
                c[0x4c] = '\0';
                c[0x4d] = '\0';
                c[0x4e] = '\0';
                c[0x4f] = '\0';
                c[0x30] = '\0';
                c[0x31] = '\0';
                c[0x32] = '\0';
                c[0x33] = '\0';
                c[0x34] = '\0';
                c[0x35] = '\0';
                c[0x36] = '\0';
                c[0x37] = '\0';
                c[0x38] = '\0';
                c[0x39] = '\0';
                c[0x3a] = '\0';
                c[0x3b] = '\0';
                c[0x3c] = '\0';
                c[0x3d] = '\0';
                c[0x3e] = '\0';
                c[0x3f] = '\0';
                c[0x20] = '\0';
                c[0x21] = '\0';
                c[0x22] = '\0';
                c[0x23] = '\0';
                c[0x24] = '\0';
                c[0x25] = '\0';
                c[0x26] = '\0';
                c[0x27] = '\0';
                c[0x28] = '\0';
                c[0x29] = '\0';
                c[0x2a] = '\0';
                c[0x2b] = '\0';
                c[0x2c] = '\0';
                c[0x2d] = '\0';
                c[0x2e] = '\0';
                c[0x2f] = '\0';
                uStack_3b0 = 0x102b56;
                OSSL_PARAM_construct_size_t(&v,"key-mesh");
                sVar3 = v;
                c[0x20] = local_340[0];
                c[0x21] = local_340[1];
                c[0x22] = local_340[2];
                c[0x23] = local_340[3];
                c[0x24] = local_340[4];
                c[0x25] = local_340[5];
                c[0x26] = local_340[6];
                c[0x27] = local_340[7];
                c[0x10] = local_350[0];
                c[0x11] = local_350[1];
                c[0x12] = local_350[2];
                c[0x13] = local_350[3];
                c[0x14] = auStack_34c[0];
                c[0x15] = auStack_34c[1];
                c[0x16] = auStack_34c[2];
                c[0x17] = auStack_34c[3];
                c[0x18] = auStack_348[0];
                c[0x19] = auStack_348[1];
                c[0x1a] = auStack_348[2];
                c[0x1b] = auStack_348[3];
                c[0x1c] = auStack_344[0];
                c[0x1d] = auStack_344[1];
                c[0x1e] = auStack_344[2];
                c[0x1f] = auStack_344[3];
                c[0] = (uchar)v;
                c[1] = v._1_1_;
                c[2] = v._2_1_;
                c[3] = v._3_1_;
                c[4] = v._4_1_;
                c[5] = v._5_1_;
                c[6] = v._6_1_;
                c[7] = v._7_1_;
                c[8] = auStack_358[0];
                c[9] = auStack_358[1];
                c[10] = auStack_358[2];
                c[0xb] = auStack_358[3];
                c[0xc] = auStack_354[0];
                c[0xd] = auStack_354[1];
                c[0xe] = auStack_354[2];
                c[0xf] = auStack_354[3];
                uStack_3b0 = 0x102b7e;
                v = sVar3;
                iVar4 = EVP_CIPHER_CTX_set_params(ctx);
                if (iVar4 == 0) {
                  uStack_3b0 = 0x102b91;
                  ERR_print_errors_fp(_stderr);
                  pcVar9 = "EVP_CIPHER_CTX_set_params(ctx, params)";
                  puVar6 = &uStack_3b0;
                  uStack_3b0 = 0x6a;
                  goto LAB_00102e9d;
                }
              }
            }
            uStack_3b0 = 0x102bd6;
            local_3a0 = cipher;
            printf(" cloned contexts: ");
            uStack_3b0 = 0x102be7;
            memset(c,0,0x100);
            lVar5 = 0;
            ctx_00 = ctx;
            do {
              if (lVar5 + 0x10 == 0x110) {
                outlen = 0x100;
                uStack_3b0 = 0x102c93;
                iVar4 = EVP_CipherFinal_ex(ctx_00,b,&tmplen);
                if (iVar4 == 0) {
                  uStack_3b0 = 0x102fa5;
                  ERR_print_errors_fp(_stderr);
                  uStack_3b0 = 0x102fbd;
                  OPENSSL_die("EVP_CipherFinal_ex(ctx, c + outlen, &tmplen)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                              ,0x81);
LAB_00102fbd:
                  uStack_3b0 = 0x102fcc;
                  ERR_print_errors_fp(_stderr);
                  uStack_3b0 = 0x102fe4;
                  OPENSSL_die("EVP_CipherUpdate(save, c, &outlen, pt, sizeof(c))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                              ,0x8f);
                }
                else {
                  uVar10 = 1;
                  pcVar9 = "\x1b[1;31m  Test FAILED\x1b[m";
                  if (outlen == 0x100) {
                    uStack_3b0 = 0x102cc6;
                    iVar4 = bcmp(c,b,0x100);
                    bVar2 = false;
                    if (iVar4 == 0) {
                      bVar2 = true;
                      pcVar9 = "\x1b[1;32m  Test passed\x1b[m";
                      uVar10 = 0;
                    }
                  }
                  else {
                    bVar2 = false;
                  }
                  uStack_3b0 = 0x102ce4;
                  puts(pcVar9);
                  uStack_3b0 = 0x102cec;
                  EVP_CIPHER_CTX_free(ctx_00);
                  if (!bVar2) {
                    uStack_3b0 = 0x102d01;
                    printf("  b[%d] = ",(ulong)(uint)outlen);
                    uStack_3b0 = 0x102d12;
                    hexdump(b,(long)outlen);
                    uStack_3b0 = 0x102d23;
                    printf("  c[%d] = ",(ulong)(uint)outlen);
                    uStack_3b0 = 0x102d31;
                    hexdump(c,(long)outlen);
                  }
                  uStack_3b0 = 0x102d3f;
                  printf("    base context: ");
                  uStack_3b0 = 0x102d53;
                  memset(c,0,0x100);
                  uStack_3b0 = 0x102d6f;
                  iVar4 = EVP_CipherUpdate(ctx,c,&outlen,pt,0x100);
                  if (iVar4 == 0) goto LAB_00102fbd;
                  uStack_3b0 = 0x102d90;
                  iVar4 = EVP_CipherFinal_ex(ctx,c + outlen,&tmplen);
                  if (iVar4 != 0) {
                    uVar8 = 1;
                    pcVar9 = "\x1b[1;31m  Test FAILED\x1b[m";
                    if (outlen == 0x100) {
                      uStack_3b0 = 0x102dc2;
                      iVar4 = bcmp(c,b,0x100);
                      bVar2 = false;
                      if (iVar4 == 0) {
                        bVar2 = true;
                        pcVar9 = "\x1b[1;32m  Test passed\x1b[m";
                        uVar8 = 0;
                      }
                    }
                    else {
                      bVar2 = false;
                    }
                    uStack_3b0 = 0x102ddf;
                    puts(pcVar9);
                    uStack_3b0 = 0x102de7;
                    EVP_CIPHER_CTX_reset(ctx);
                    uStack_3b0 = 0x102def;
                    EVP_CIPHER_CTX_reset(ctx);
                    uStack_3b0 = 0x102df7;
                    EVP_CIPHER_CTX_free(ctx);
                    uStack_3b0 = 0x102e01;
                    EVP_CIPHER_free(local_3a0);
                    if (!bVar2) {
                      uStack_3b0 = 0x102e16;
                      printf("  b[%d] = ",(ulong)(uint)outlen);
                      uStack_3b0 = 0x102e27;
                      hexdump(b,(long)outlen);
                      uStack_3b0 = 0x102e38;
                      printf("  c[%d] = ",(ulong)(uint)outlen);
                      uStack_3b0 = 0x102e46;
                      hexdump(c,(long)outlen);
                    }
                    return uVar8 | uVar10;
                  }
                }
                uStack_3b0 = 0x102ff3;
                ERR_print_errors_fp(_stderr);
                uStack_3b0 = 0x10300b;
                OPENSSL_die("EVP_CipherFinal_ex(save, c + outlen, &tmplen)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                            ,0x90);
                goto LAB_0010300b;
              }
              uStack_3b0 = 0x102bff;
              out = EVP_CIPHER_CTX_new();
              if (out == (EVP_CIPHER_CTX *)0x0) {
                uStack_3b0 = 0x102e6c;
                ERR_print_errors_fp(_stderr);
                pcVar9 = "copy";
                puVar6 = &uStack_3b0;
                uStack_3b0 = 0x76;
                goto LAB_00102e9d;
              }
              uStack_3b0 = 0x102c16;
              iVar4 = EVP_CIPHER_CTX_copy(out,ctx_00);
              if (iVar4 == 0) {
                uStack_3b0 = 0x102e8d;
                ERR_print_errors_fp(_stderr);
                pcVar9 = "EVP_CIPHER_CTX_copy(copy, ctx)";
                puVar6 = &uStack_3b0;
                uStack_3b0 = 0x77;
                goto LAB_00102e9d;
              }
              if (ctx != ctx_00) {
                uStack_3b0 = 0x102c2b;
                EVP_CIPHER_CTX_free(ctx_00);
              }
              uStack_3b0 = 0x102c49;
              iVar4 = EVP_CipherUpdate(out,c + lVar5,&outlen,pt + lVar5,0x10);
              lVar5 = lVar5 + 0x10;
              ctx_00 = out;
            } while (iVar4 != 0);
            uStack_3b0 = 0x102c62;
            ERR_print_errors_fp(_stderr);
            pcVar9 = 
            "EVP_CipherUpdate(ctx, c + STEP_SIZE * i, &outlen, pt + STEP_SIZE * i, STEP_SIZE)";
            puVar6 = &uStack_3b0;
            uStack_3b0 = 0x7d;
          }
        }
      }
    }
  }
LAB_00102e9d:
  do {
    uVar1 = *puVar6;
    piVar7 = (int *)(puVar6 + 1);
    *puVar6 = 0x102ea3;
    OPENSSL_die(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,uVar1);
LAB_00102ea3:
    *(undefined8 *)((long)piVar7 + -8) = 0x102eb2;
    ERR_print_errors_fp(_stderr);
    pcVar9 = "ctx";
    puVar6 = (undefined8 *)((long)piVar7 + -8);
    *(undefined8 *)((long)piVar7 + -8) = 0x4e;
  } while( true );
}

Assistant:

static int test_contexts_cipher(const char *name, const int enc, int acpkm)
{
    EVP_CIPHER_CTX *ctx, *save;
    unsigned char pt[TEST_SIZE] = {1};
    unsigned char b[TEST_SIZE]; /* base output */
    unsigned char c[TEST_SIZE]; /* cloned output */
    unsigned char K[32] = {1};
    unsigned char iv[16] = {1};
    int outlen, tmplen;
    int ret = 0, test = 0;

    EVP_CIPHER *type;
    ERR_set_mark();
    T((type = (EVP_CIPHER *)EVP_get_cipherbyname(name))
      || (type = EVP_CIPHER_fetch(NULL, name, NULL)));
    ERR_pop_to_mark();

    printf(cBLUE "%s test for %s" cNORM "\n",
           enc ? "Encryption" : "Decryption", name);

    /* produce base encryption */
    ctx = EVP_CIPHER_CTX_new();
    T(ctx);
    T(EVP_CipherInit_ex(ctx, type, NULL, K, iv, enc));
    if (acpkm) {
	if (EVP_CIPHER_get0_provider(type) != NULL) {
	    OSSL_PARAM params[] = { OSSL_PARAM_END, OSSL_PARAM_END };
	    size_t v = (size_t)acpkm;

	    params[0] = OSSL_PARAM_construct_size_t("key-mesh", &v);
	    T(EVP_CIPHER_CTX_set_params(ctx, params));
	} else {
	    T(EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, acpkm, NULL));
	}
    }
    T(EVP_CIPHER_CTX_set_padding(ctx, 0));
    T(EVP_CipherUpdate(ctx, b, &outlen, pt, sizeof(b)));
    T(EVP_CipherFinal_ex(ctx, b + outlen, &tmplen));

    /* and now tests */
    EVP_CIPHER_CTX_reset(ctx);
    EVP_CIPHER_CTX_reset(ctx); /* double call is intentional */
    T(EVP_CipherInit_ex(ctx, type, NULL, K, iv, enc));
    T(EVP_CIPHER_CTX_set_padding(ctx, 0));
    if (acpkm) {
	if (EVP_CIPHER_get0_provider(type) != NULL) {
	    OSSL_PARAM params[] = { OSSL_PARAM_END, OSSL_PARAM_END };
	    size_t v = (size_t)acpkm;

	    params[0] = OSSL_PARAM_construct_size_t("key-mesh", &v);
	    T(EVP_CIPHER_CTX_set_params(ctx, params));
	} else {
	    T(EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, acpkm, NULL));
	}
    }
    save = ctx;

    printf(" cloned contexts: ");
    int i;
    memset(c, 0, sizeof(c));
    for (i = 0; i < TEST_SIZE / STEP_SIZE; i++) {
	EVP_CIPHER_CTX *copy = EVP_CIPHER_CTX_new();
	T(copy);
	T(EVP_CIPHER_CTX_copy(copy, ctx));
	if (save != ctx) /* else original context */
	    EVP_CIPHER_CTX_free(ctx);
	ctx = copy;

	T(EVP_CipherUpdate(ctx, c + STEP_SIZE * i, &outlen,
			   pt + STEP_SIZE * i, STEP_SIZE));
    }

    outlen = i * STEP_SIZE;
    T(EVP_CipherFinal_ex(ctx, c + outlen, &tmplen));
    TEST_ASSERT(outlen != TEST_SIZE || memcmp(c, b, TEST_SIZE));
    EVP_CIPHER_CTX_free(ctx);
    if (test) {
	printf("  b[%d] = ", outlen);
	hexdump(b, outlen);
	printf("  c[%d] = ", outlen);
	hexdump(c, outlen);
    }
    ret |= test;

    /* resume original context */
    printf("    base context: ");
    memset(c, 0, sizeof(c));
    T(EVP_CipherUpdate(save, c, &outlen, pt, sizeof(c)));
    T(EVP_CipherFinal_ex(save, c + outlen, &tmplen));
    TEST_ASSERT(outlen != TEST_SIZE || memcmp(c, b, TEST_SIZE));
    EVP_CIPHER_CTX_cleanup(save); /* multiple calls are intentional */
    EVP_CIPHER_CTX_cleanup(save);
    EVP_CIPHER_CTX_free(save);
    EVP_CIPHER_free(type);
    if (test) {
	printf("  b[%d] = ", outlen);
	hexdump(b, outlen);
	printf("  c[%d] = ", outlen);
	hexdump(c, outlen);
    }
    ret |= test;

    return ret;
}